

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall minibag::View::~View(View *this)

{
  pointer ppMVar1;
  pointer ppBVar2;
  BagQuery *pBVar3;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *__range1;
  pointer ppBVar4;
  pointer ppMVar5;
  
  ppMVar1 = (this->ranges_).
            super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar5 = (this->ranges_).
                 super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar5 != ppMVar1;
      ppMVar5 = ppMVar5 + 1) {
    operator_delete(*ppMVar5,0x20);
  }
  ppBVar2 = (this->queries_).
            super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->queries_).
                 super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar2; ppBVar4 = ppBVar4 + 1
      ) {
    pBVar3 = *ppBVar4;
    if (pBVar3 != (BagQuery *)0x0) {
      std::_Function_base::~_Function_base((_Function_base *)&pBVar3->query);
    }
    operator_delete(pBVar3,0x40);
  }
  std::_Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::~_Vector_base
            (&(this->queries_).
              super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>);
  std::_Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::
  ~_Vector_base((_Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *)
                this);
  return;
}

Assistant:

View::~View() {
    for (MessageRange* range : ranges_)
        delete range;
    for (BagQuery* query : queries_)
        delete query;
}